

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostl.c
# Opt level: O0

int trico_read_stl_full(uint32_t *nr_of_vertices,float **vertices,uint32_t *nr_of_triangles,
                       uint32_t **triangles,float **normals,uint16_t **attributes,char *filename)

{
  float fVar1;
  int iVar2;
  uint32_t *puVar3;
  float *pfVar4;
  uint16_t *puVar5;
  bool bVar6;
  uint16_t *local_c0;
  uint16_t *attr_it;
  float *norm_it;
  float *vert_it;
  uint32_t *tria_it;
  undefined4 local_98;
  uint32_t count_triangles;
  char buffer [80];
  FILE *inputfile;
  uint16_t **attributes_local;
  float **normals_local;
  uint32_t **triangles_local;
  uint32_t *nr_of_triangles_local;
  float **vertices_local;
  uint32_t *nr_of_vertices_local;
  
  *vertices = (float *)0x0;
  *triangles = (uint32_t *)0x0;
  *nr_of_vertices = 0;
  *nr_of_triangles = 0;
  buffer._72_8_ = fopen(filename,"rb");
  if ((FILE *)buffer._72_8_ == (FILE *)0x0) {
    nr_of_vertices_local._4_4_ = 0;
  }
  else if ((FILE *)buffer._72_8_ == (FILE *)0x0) {
    nr_of_vertices_local._4_4_ = 0;
  }
  else {
    fread(&local_98,1,0x50,(FILE *)buffer._72_8_);
    if (((((char)local_98 == 's') && (local_98._1_1_ == 'o')) && (local_98._2_1_ == 'l')) &&
       ((local_98._3_1_ == 'i' && ((char)count_triangles == 'd')))) {
      fclose((FILE *)buffer._72_8_);
      nr_of_vertices_local._4_4_ = 0;
    }
    else {
      fread(nr_of_triangles,4,1,(FILE *)buffer._72_8_);
      puVar3 = (uint32_t *)trico_malloc((ulong)(*nr_of_triangles * 3) << 2);
      *triangles = puVar3;
      pfVar4 = (float *)trico_malloc((ulong)(*nr_of_triangles * 3) << 2);
      *normals = pfVar4;
      puVar5 = (uint16_t *)trico_malloc((ulong)*nr_of_triangles << 1);
      *attributes = puVar5;
      tria_it._4_4_ = 0;
      *nr_of_vertices = 0;
      pfVar4 = (float *)trico_malloc((ulong)(*nr_of_triangles * 9) << 2);
      *vertices = pfVar4;
      vert_it = (float *)*triangles;
      norm_it = *vertices;
      attr_it = (uint16_t *)*normals;
      local_c0 = *attributes;
      while( true ) {
        iVar2 = feof((FILE *)buffer._72_8_);
        bVar6 = false;
        if (iVar2 == 0) {
          bVar6 = tria_it._4_4_ < *nr_of_triangles;
        }
        if (!bVar6) break;
        tria_it._4_4_ = tria_it._4_4_ + 1;
        fread(&local_98,1,0x32,(FILE *)buffer._72_8_);
        *(undefined4 *)attr_it = local_98;
        puVar5 = attr_it + 4;
        *(uint32_t *)(attr_it + 2) = count_triangles;
        attr_it = attr_it + 6;
        *(undefined4 *)puVar5 = buffer._0_4_;
        *norm_it = (float)buffer._4_4_;
        norm_it[1] = (float)buffer._8_4_;
        norm_it[2] = (float)buffer._12_4_;
        norm_it[3] = (float)buffer._16_4_;
        norm_it[4] = (float)buffer._20_4_;
        norm_it[5] = (float)buffer._24_4_;
        norm_it[6] = (float)buffer._28_4_;
        pfVar4 = norm_it + 8;
        norm_it[7] = (float)buffer._32_4_;
        norm_it = norm_it + 9;
        *pfVar4 = (float)buffer._36_4_;
        *local_c0 = buffer._40_2_;
        fVar1 = (float)*nr_of_vertices;
        *nr_of_vertices = (int)fVar1 + 1;
        *vert_it = fVar1;
        fVar1 = (float)*nr_of_vertices;
        *nr_of_vertices = (int)fVar1 + 1;
        pfVar4 = vert_it + 2;
        vert_it[1] = fVar1;
        fVar1 = (float)*nr_of_vertices;
        *nr_of_vertices = (int)fVar1 + 1;
        vert_it = vert_it + 3;
        *pfVar4 = fVar1;
        local_c0 = local_c0 + 1;
      }
      fclose((FILE *)buffer._72_8_);
      if (tria_it._4_4_ == *nr_of_triangles) {
        trico_remove_duplicate_vertices(nr_of_vertices,vertices,*nr_of_triangles,triangles);
        pfVar4 = (float *)trico_realloc(*vertices,(ulong)(*nr_of_vertices * 3) << 2);
        *vertices = pfVar4;
        nr_of_vertices_local._4_4_ = 1;
      }
      else {
        nr_of_vertices_local._4_4_ = 0;
      }
    }
  }
  return nr_of_vertices_local._4_4_;
}

Assistant:

int trico_read_stl_full(uint32_t* nr_of_vertices, float** vertices, uint32_t* nr_of_triangles, uint32_t** triangles, float** normals, uint16_t** attributes, const char* filename)
  {
  *vertices = NULL;
  *triangles = NULL;
  *nr_of_vertices = 0;
  *nr_of_triangles = 0;
  FILE* inputfile = fopen(filename, "rb");
  if (!inputfile)
    return 0;

  if (!inputfile)
    return 0;

  char buffer[80];
  fread(buffer, 1, 80, inputfile);

  if (buffer[0] == 's' && buffer[1] == 'o' && buffer[2] == 'l' && buffer[3] == 'i' && buffer[4] == 'd')
    {
    fclose(inputfile);
    return 0;
    }

  fread((void*)(nr_of_triangles), sizeof(uint32_t), 1, inputfile);
  *triangles = (uint32_t*)trico_malloc(*nr_of_triangles * 3 * sizeof(uint32_t));
  *normals = (float*)trico_malloc(*nr_of_triangles * 3 * sizeof(float));
  *attributes = (uint16_t*)trico_malloc(*nr_of_triangles * sizeof(uint16_t));
  uint32_t count_triangles = 0;
  *nr_of_vertices = 0;
  *vertices = (float*)trico_malloc(*nr_of_triangles * 9 * sizeof(float));

  uint32_t* tria_it = *triangles;
  float* vert_it = *vertices;
  float* norm_it = *normals;
  uint16_t* attr_it = *attributes;
  while (!feof(inputfile) && count_triangles < *nr_of_triangles)
    {
    ++count_triangles;
    fread(buffer, 1, 50, inputfile);
    *norm_it++ = *(float*)(&(buffer[0]));
    *norm_it++ = *(float*)(&(buffer[4]));
    *norm_it++ = *(float*)(&(buffer[8]));
    *vert_it++ = *(float*)(&(buffer[12]));
    *vert_it++ = *(float*)(&(buffer[16]));
    *vert_it++ = *(float*)(&(buffer[20]));
    *vert_it++ = *(float*)(&(buffer[24]));
    *vert_it++ = *(float*)(&(buffer[28]));
    *vert_it++ = *(float*)(&(buffer[32]));
    *vert_it++ = *(float*)(&(buffer[36]));
    *vert_it++ = *(float*)(&(buffer[40]));
    *vert_it++ = *(float*)(&(buffer[44]));
    *attr_it++ = *(uint16_t*)(&(buffer[48]));
    *tria_it++ = (*nr_of_vertices)++;
    *tria_it++ = (*nr_of_vertices)++;
    *tria_it++ = (*nr_of_vertices)++;
    }
  fclose(inputfile);
  if (count_triangles != *nr_of_triangles)
    return 0;

  trico_remove_duplicate_vertices(nr_of_vertices, vertices, *nr_of_triangles, triangles);
  *vertices = (float*)trico_realloc(*vertices, *nr_of_vertices * 3 * sizeof(float));
  return 1;
  }